

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O3

int32_t __thiscall
icu_63::CollationDataBuilder::getCEs
          (CollationDataBuilder *this,UnicodeString *prefix,UnicodeString *s,int64_t *ces,
          int32_t cesLength)

{
  short sVar1;
  int32_t iVar2;
  int start;
  UnicodeString UStack_68;
  
  sVar1 = (prefix->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    start = (prefix->fUnion).fFields.fLength;
  }
  else {
    start = (int)sVar1 >> 5;
  }
  if (start != 0) {
    operator+(&UStack_68,prefix,s);
    iVar2 = getCEs(this,&UStack_68,start,ces,cesLength);
    UnicodeString::~UnicodeString(&UStack_68);
    return iVar2;
  }
  iVar2 = getCEs(this,s,0,ces,cesLength);
  return iVar2;
}

Assistant:

int32_t
CollationDataBuilder::getCEs(const UnicodeString &prefix, const UnicodeString &s,
                             int64_t ces[], int32_t cesLength) {
    int32_t prefixLength = prefix.length();
    if(prefixLength == 0) {
        return getCEs(s, 0, ces, cesLength);
    } else {
        return getCEs(prefix + s, prefixLength, ces, cesLength);
    }
}